

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack8.h
# Opt level: O1

void ncnn::convolution_winograd_dot_pack8_avx
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint _w;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  int iVar28;
  uint uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  void *pvVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [32];
  ulong uVar36;
  float *pfVar37;
  ulong uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  ulong local_a8;
  Mat local_98;
  Mat *local_50;
  ulong local_48;
  Mat *local_40;
  ulong local_38;
  
  _w = bottom_blob_tm->w;
  uVar38 = (ulong)(int)_w;
  uVar20 = bottom_blob_tm->h;
  uVar36 = (ulong)uVar20;
  iVar5 = bottom_blob_tm->c;
  local_98.cstep = 0;
  local_98.data = (Allocator *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elempack = 0;
  local_98._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if ((long)uVar38 < 0xc) {
    if ((int)_w < 8) {
      if ((int)_w < 4) {
        uVar29 = _w;
        iVar28 = iVar5;
        if (1 < (int)_w) {
          iVar28 = iVar5 * 2;
          uVar29 = (_w & 1) + 1;
        }
      }
      else {
        uVar29 = (_w & 1) + 1 + (uint)((_w >> 1 & 1) != 0);
        iVar28 = iVar5 * 4;
      }
    }
    else {
      uVar29 = (_w & 1) + 1 + (_w >> 2 & 1) + (uint)((_w >> 1 & 1) != 0);
      iVar28 = iVar5 * 8;
    }
  }
  else {
    uVar29 = _w % 0xc;
    uVar29 = (uVar29 & 1) + (uVar29 >> 3) + _w / 0xc + (uVar29 >> 2 & 1) +
             (uint)((uVar29 >> 1 & 1) != 0);
    iVar28 = iVar5 * 0xc;
  }
  local_98.elemsize._4_4_ = (int)local_98.refcount;
  local_98.allocator = (Allocator *)local_98.data;
  local_98.dims = (int)local_98.refcount;
  local_98.w = local_98.refcount._4_4_;
  local_98.c = local_98.elempack;
  local_50 = top_blob_tm;
  local_40 = kernel_tm;
  Mat::create(&local_98,iVar28,uVar29,uVar20,0x20,8,opt->workspace_allocator);
  if (0 < (int)uVar20) {
    uVar30 = 0;
    do {
      lVar24 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
      lVar32 = local_98.cstep * uVar30 * lVar24;
      lVar19 = (long)local_98.w;
      uVar34 = 0;
      if (0xb < (int)_w) {
        uVar34 = 0;
        do {
          iVar28 = (int)uVar34;
          if (0 < iVar5) {
            pauVar35 = (undefined1 (*) [32])
                       ((ulong)((_w * (int)uVar30 + iVar28) * 8) * 4 + (long)bottom_blob_tm->data);
            pauVar27 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_98.data +
                       (uVar34 / 0xc) * lVar24 * lVar19 + lVar32);
            iVar18 = iVar5;
            do {
              auVar48 = vunpcklps_avx(*pauVar35,pauVar35[1]);
              auVar54 = vunpckhps_avx(*pauVar35,pauVar35[1]);
              auVar80 = vunpcklps_avx(pauVar35[2],pauVar35[3]);
              auVar53 = vunpckhps_avx(pauVar35[2],pauVar35[3]);
              auVar92 = vunpcklps_avx(pauVar35[4],pauVar35[5]);
              auVar47 = vunpckhps_avx(pauVar35[4],pauVar35[5]);
              auVar70 = vunpcklps_avx(pauVar35[6],pauVar35[7]);
              auVar58 = vunpckhps_avx(pauVar35[6],pauVar35[7]);
              auVar81 = vunpcklps_avx(pauVar35[8],pauVar35[9]);
              auVar65 = vunpckhps_avx(pauVar35[8],pauVar35[9]);
              auVar84 = vunpcklps_avx(pauVar35[10],pauVar35[0xb]);
              auVar62 = vunpckhps_avx(pauVar35[10],pauVar35[0xb]);
              auVar69 = vunpcklpd_avx(auVar48,auVar80);
              auVar48 = vunpckhpd_avx(auVar48,auVar80);
              auVar80 = vunpcklpd_avx(auVar54,auVar53);
              auVar54 = vunpckhpd_avx(auVar54,auVar53);
              auVar74 = vunpcklpd_avx(auVar92,auVar70);
              auVar53 = vunpckhpd_avx(auVar92,auVar70);
              auVar92 = vunpcklpd_avx(auVar47,auVar58);
              auVar47 = vunpckhpd_avx(auVar47,auVar58);
              auVar70 = vunpcklpd_avx(auVar81,auVar84);
              auVar58 = vunpckhpd_avx(auVar81,auVar84);
              auVar81 = vunpcklpd_avx(auVar65,auVar62);
              auVar65 = vunpckhpd_avx(auVar65,auVar62);
              auVar84._16_16_ = auVar74._0_16_;
              auVar84._0_16_ = auVar69._0_16_;
              auVar62 = vperm2f128_avx(auVar69,auVar74,0x31);
              auVar88._16_16_ = auVar48._0_16_;
              auVar88._0_16_ = auVar70._0_16_;
              auVar48 = vperm2f128_avx(auVar70,auVar48,0x31);
              auVar69._16_16_ = auVar58._0_16_;
              auVar69._0_16_ = auVar53._0_16_;
              auVar53 = vperm2f128_avx(auVar53,auVar58,0x31);
              auVar74._16_16_ = auVar92._0_16_;
              auVar74._0_16_ = auVar80._0_16_;
              auVar58 = vperm2f128_avx(auVar80,auVar92,0x31);
              auVar92._16_16_ = auVar54._0_16_;
              auVar92._0_16_ = auVar81._0_16_;
              auVar54 = vperm2f128_avx(auVar81,auVar54,0x31);
              auVar80._16_16_ = auVar65._0_16_;
              auVar80._0_16_ = auVar47._0_16_;
              auVar47 = vperm2f128_avx(auVar47,auVar65,0x31);
              *pauVar27 = auVar84;
              pauVar27[1] = auVar88;
              pauVar27[2] = auVar69;
              pauVar27[3] = auVar74;
              pauVar27[4] = auVar92;
              pauVar27[5] = auVar80;
              pauVar27[6] = auVar62;
              pauVar27[7] = auVar48;
              pauVar27[8] = auVar53;
              pauVar27[9] = auVar58;
              pauVar27[10] = auVar54;
              pauVar27[0xb] = auVar47;
              pauVar35 = pauVar35 + bottom_blob_tm->cstep;
              pauVar27 = pauVar27 + 0xc;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar34 = uVar34 + 0xc;
        } while (iVar28 + 0x17 < (int)_w);
      }
      if ((int)uVar34 + 7 < (int)_w) {
        uVar23 = (long)(int)uVar34;
        do {
          if (0 < iVar5) {
            pauVar27 = (undefined1 (*) [32])
                       ((uVar23 + uVar30 * uVar38) * 0x20 + (long)bottom_blob_tm->data);
            pauVar35 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)(((uint)((int)uVar23 + (int)((uVar23 & 0xffffffff) / 0xc) * -0xc) >> 3
                               ) + (int)((uVar23 & 0xffffffff) / 0xc)) * lVar24 * lVar19 + lVar32);
            iVar28 = iVar5;
            do {
              auVar48 = vunpcklps_avx(*pauVar27,pauVar27[1]);
              auVar54 = vunpckhps_avx(*pauVar27,pauVar27[1]);
              auVar62 = vunpcklps_avx(pauVar27[2],pauVar27[3]);
              auVar53 = vunpckhps_avx(pauVar27[2],pauVar27[3]);
              auVar80 = vunpcklps_avx(pauVar27[4],pauVar27[5]);
              auVar47 = vunpckhps_avx(pauVar27[4],pauVar27[5]);
              auVar74 = vunpcklps_avx(pauVar27[6],pauVar27[7]);
              auVar58 = vunpckhps_avx(pauVar27[6],pauVar27[7]);
              auVar65 = vunpcklpd_avx(auVar48,auVar62);
              auVar48 = vunpckhpd_avx(auVar48,auVar62);
              auVar62 = vunpcklpd_avx(auVar54,auVar53);
              auVar54 = vunpckhpd_avx(auVar54,auVar53);
              auVar69 = vunpcklpd_avx(auVar80,auVar74);
              auVar53 = vunpckhpd_avx(auVar80,auVar74);
              auVar80 = vunpcklpd_avx(auVar47,auVar58);
              auVar47 = vunpckhpd_avx(auVar47,auVar58);
              auVar70._16_16_ = auVar69._0_16_;
              auVar70._0_16_ = auVar65._0_16_;
              auVar81._16_16_ = auVar53._0_16_;
              auVar81._0_16_ = auVar48._0_16_;
              auVar85._16_16_ = auVar80._0_16_;
              auVar85._0_16_ = auVar62._0_16_;
              auVar89._16_16_ = auVar47._0_16_;
              auVar89._0_16_ = auVar54._0_16_;
              auVar58 = vperm2f128_avx(auVar65,auVar69,0x31);
              auVar48 = vperm2f128_avx(auVar48,auVar53,0x31);
              auVar53 = vperm2f128_avx(auVar62,auVar80,0x31);
              auVar54 = vperm2f128_avx(auVar54,auVar47,0x31);
              *pauVar35 = auVar70;
              pauVar35[1] = auVar81;
              pauVar35[2] = auVar85;
              pauVar35[3] = auVar89;
              pauVar35[4] = auVar58;
              pauVar35[5] = auVar48;
              pauVar35[6] = auVar53;
              pauVar35[7] = auVar54;
              pauVar27 = pauVar27 + bottom_blob_tm->cstep;
              pauVar35 = pauVar35 + 8;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar34 = uVar23 + 8;
          bVar10 = (long)uVar23 < (long)(uVar38 - 0xf);
          uVar23 = uVar34;
        } while (bVar10);
      }
      if ((int)((uint)uVar34 | 3) < (int)_w) {
        uVar23 = (long)(int)(uint)uVar34;
        do {
          if (0 < iVar5) {
            pauVar27 = (undefined1 (*) [32])
                       ((uVar23 + uVar30 * uVar38) * 0x20 + (long)bottom_blob_tm->data);
            uVar29 = (int)uVar23 + (int)((uVar23 & 0xffffffff) / 0xc) * -0xc;
            pauVar35 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)((uVar29 >> 3) + (int)((uVar23 & 0xffffffff) / 0xc) +
                              (uint)((uVar29 >> 2 & 1) != 0)) * lVar24 * lVar19 + lVar32);
            iVar28 = iVar5;
            do {
              auVar48 = vunpcklps_avx(*pauVar27,pauVar27[1]);
              auVar54 = vunpckhps_avx(*pauVar27,pauVar27[1]);
              auVar58 = vunpcklps_avx(pauVar27[2],pauVar27[3]);
              auVar53 = vunpckhps_avx(pauVar27[2],pauVar27[3]);
              auVar47 = vunpcklpd_avx(auVar48,auVar58);
              auVar48 = vunpckhpd_avx(auVar48,auVar58);
              auVar58 = vunpcklpd_avx(auVar54,auVar53);
              auVar54 = vunpckhpd_avx(auVar54,auVar53);
              auVar53._16_16_ = auVar48._0_16_;
              auVar53._0_16_ = auVar47._0_16_;
              auVar65._16_16_ = auVar54._0_16_;
              auVar65._0_16_ = auVar58._0_16_;
              auVar48 = vperm2f128_avx(auVar47,auVar48,0x31);
              auVar54 = vperm2f128_avx(auVar58,auVar54,0x31);
              *pauVar35 = auVar53;
              pauVar35[1] = auVar65;
              pauVar35[2] = auVar48;
              pauVar35[3] = auVar54;
              pauVar27 = pauVar27 + bottom_blob_tm->cstep;
              pauVar35 = pauVar35 + 4;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar34 = uVar23 + 4;
          lVar22 = uVar23 + 7;
          uVar23 = uVar34;
        } while (lVar22 < (long)uVar38);
      }
      if ((int)((uint)uVar34 | 1) < (int)_w) {
        uVar23 = (long)(int)(uint)uVar34;
        do {
          if (0 < iVar5) {
            pauVar27 = (undefined1 (*) [32])
                       ((uVar23 + uVar30 * uVar38) * 0x20 + (long)bottom_blob_tm->data);
            uVar29 = (int)uVar23 + (int)((uVar23 & 0xffffffff) / 0xc) * -0xc;
            pauVar35 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)((uVar29 >> 2 & 1) +
                               (uVar29 >> 3) + (int)((uVar23 & 0xffffffff) / 0xc) +
                              (uint)((uVar29 >> 1 & 1) != 0)) * lVar24 * lVar19 + lVar32);
            iVar28 = iVar5;
            do {
              auVar54 = vunpcklps_avx(*pauVar27,pauVar27[1]);
              auVar48 = vunpckhps_avx(*pauVar27,pauVar27[1]);
              auVar47._16_16_ = auVar48._0_16_;
              auVar47._0_16_ = auVar54._0_16_;
              auVar48 = vperm2f128_avx(auVar54,auVar48,0x31);
              *pauVar35 = auVar47;
              pauVar35[1] = auVar48;
              pauVar27 = pauVar27 + bottom_blob_tm->cstep;
              pauVar35 = pauVar35 + 2;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar34 = uVar23 + 2;
          lVar22 = uVar23 + 3;
          uVar23 = uVar34;
        } while (lVar22 < (long)uVar38);
      }
      if ((int)uVar34 < (int)_w) {
        uVar34 = (ulong)(int)uVar34;
        do {
          if (0 < iVar5) {
            pauVar27 = (undefined1 (*) [32])
                       ((uVar34 + uVar30 * uVar38) * 0x20 + (long)bottom_blob_tm->data);
            uVar29 = (int)uVar34 + (int)((uVar34 & 0xffffffff) / 0xc) * -0xc;
            pauVar35 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)((uVar29 >> 2 & 1) +
                               (uVar29 & 1) + (uVar29 >> 3) + (int)((uVar34 & 0xffffffff) / 0xc) +
                              (uint)((uVar29 >> 1 & 1) != 0)) * lVar24 * lVar19 + lVar32);
            iVar28 = iVar5;
            do {
              *pauVar35 = *pauVar27;
              pauVar35 = pauVar35 + 1;
              pauVar27 = pauVar27 + bottom_blob_tm->cstep;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar38);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != uVar36);
  }
  piVar6 = bottom_blob_tm->refcount;
  local_48 = uVar36;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (bottom_blob_tm->allocator == (Allocator *)0x0) {
        if (bottom_blob_tm->data != (void *)0x0) {
          free(bottom_blob_tm->data);
        }
      }
      else {
        (*bottom_blob_tm->allocator->_vptr_Allocator[3])();
      }
    }
  }
  bottom_blob_tm->cstep = 0;
  *(undefined4 *)&bottom_blob_tm->data = 0;
  *(undefined4 *)((long)&bottom_blob_tm->data + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->refcount = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->elemsize = 0;
  *(undefined4 *)((long)&bottom_blob_tm->elemsize + 4) = 0;
  bottom_blob_tm->elempack = 0;
  *(undefined4 *)&bottom_blob_tm->allocator = 0;
  *(undefined4 *)((long)&bottom_blob_tm->allocator + 4) = 0;
  bottom_blob_tm->dims = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->h = 0;
  bottom_blob_tm->d = 0;
  bottom_blob_tm->c = 0;
  Mat::create(local_50,_w,uVar20,outch,0x20,8,opt->workspace_allocator);
  if (0 < outch) {
    iVar28 = 1;
    if (1 < iVar5 * 8) {
      iVar28 = iVar5 * 8;
    }
    local_38 = (ulong)(uint)outch;
    local_a8 = 0;
    do {
      if (0 < (int)uVar36) {
        sVar7 = local_40->cstep;
        pvVar8 = local_40->data;
        sVar9 = local_40->elemsize;
        lVar24 = (long)local_40->w * sVar9;
        pauVar27 = (undefined1 (*) [32])
                   (local_50->cstep * local_a8 * local_50->elemsize + (long)local_50->data);
        pvVar33 = (void *)(sVar7 * sVar9 * local_a8 + (long)pvVar8);
        uVar38 = 0;
        do {
          lVar32 = local_98.cstep * uVar38;
          lVar19 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
          uVar30 = 0;
          lVar22 = (long)local_98.w;
          if (0xb < (int)_w) {
            uVar34 = 0;
            do {
              if (iVar5 < 1) {
                auVar48 = SUB6432(ZEXT864(0),0);
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                fVar45 = 0.0;
                fVar46 = 0.0;
                auVar54 = SUB6432(ZEXT864(0),0);
                auVar58 = SUB6432(ZEXT864(0),0);
                auVar62 = SUB6432(ZEXT864(0),0);
                auVar66 = SUB6432(ZEXT864(0),0);
                auVar71 = SUB6432(ZEXT864(0),0);
                auVar78 = SUB6432(ZEXT864(0),0);
                auVar82 = SUB6432(ZEXT864(0),0);
                auVar86 = SUB6432(ZEXT864(0),0);
                auVar90 = SUB6432(ZEXT864(0),0);
                auVar75 = SUB6432(ZEXT864(0),0);
              }
              else {
                pfVar25 = (float *)((long)(_func_int ***)local_98.data +
                                   (uVar34 / 0xc) * lVar19 * lVar22 + lVar32 * lVar19);
                auVar77 = ZEXT864(0);
                auVar91 = ZEXT864(0);
                auVar87 = ZEXT864(0);
                auVar83 = ZEXT864(0);
                auVar79 = ZEXT864(0);
                auVar73 = ZEXT864(0);
                auVar68 = ZEXT864(0);
                auVar64 = ZEXT864(0);
                auVar61 = ZEXT864(0);
                auVar57 = ZEXT864(0);
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                fVar45 = 0.0;
                fVar46 = 0.0;
                auVar52 = ZEXT864(0);
                pfVar37 = (float *)((long)pvVar8 + lVar24 * uVar38 + sVar7 * local_a8 * sVar9);
                iVar18 = iVar28;
                do {
                  fVar1 = *pfVar25;
                  fVar2 = pfVar25[1];
                  fVar11 = *pfVar37;
                  fVar12 = pfVar37[1];
                  fVar13 = pfVar37[2];
                  fVar14 = pfVar37[3];
                  fVar15 = pfVar37[4];
                  fVar16 = pfVar37[5];
                  fVar17 = pfVar37[6];
                  auVar75._0_4_ = fVar1 * fVar11 + auVar77._0_4_;
                  auVar75._4_4_ = fVar1 * fVar12 + auVar77._4_4_;
                  auVar75._8_4_ = fVar1 * fVar13 + auVar77._8_4_;
                  auVar75._12_4_ = fVar1 * fVar14 + auVar77._12_4_;
                  auVar75._16_4_ = fVar1 * fVar15 + auVar77._16_4_;
                  auVar75._20_4_ = fVar1 * fVar16 + auVar77._20_4_;
                  auVar75._24_4_ = fVar1 * fVar17 + auVar77._24_4_;
                  auVar75._28_4_ = fVar1 + auVar77._28_4_;
                  auVar77 = ZEXT3264(auVar75);
                  fVar3 = pfVar25[2];
                  fVar4 = pfVar25[3];
                  auVar90._0_4_ = fVar2 * fVar11 + auVar91._0_4_;
                  auVar90._4_4_ = fVar2 * fVar12 + auVar91._4_4_;
                  auVar90._8_4_ = fVar2 * fVar13 + auVar91._8_4_;
                  auVar90._12_4_ = fVar2 * fVar14 + auVar91._12_4_;
                  auVar90._16_4_ = fVar2 * fVar15 + auVar91._16_4_;
                  auVar90._20_4_ = fVar2 * fVar16 + auVar91._20_4_;
                  auVar90._24_4_ = fVar2 * fVar17 + auVar91._24_4_;
                  auVar90._28_4_ = fVar1 + auVar91._28_4_;
                  auVar91 = ZEXT3264(auVar90);
                  auVar86._0_4_ = fVar3 * fVar11 + auVar87._0_4_;
                  auVar86._4_4_ = fVar3 * fVar12 + auVar87._4_4_;
                  auVar86._8_4_ = fVar3 * fVar13 + auVar87._8_4_;
                  auVar86._12_4_ = fVar3 * fVar14 + auVar87._12_4_;
                  auVar86._16_4_ = fVar3 * fVar15 + auVar87._16_4_;
                  auVar86._20_4_ = fVar3 * fVar16 + auVar87._20_4_;
                  auVar86._24_4_ = fVar3 * fVar17 + auVar87._24_4_;
                  auVar86._28_4_ = fVar1 + auVar87._28_4_;
                  auVar87 = ZEXT3264(auVar86);
                  fVar2 = pfVar25[4];
                  fVar3 = pfVar25[5];
                  auVar82._0_4_ = fVar4 * fVar11 + auVar83._0_4_;
                  auVar82._4_4_ = fVar4 * fVar12 + auVar83._4_4_;
                  auVar82._8_4_ = fVar4 * fVar13 + auVar83._8_4_;
                  auVar82._12_4_ = fVar4 * fVar14 + auVar83._12_4_;
                  auVar82._16_4_ = fVar4 * fVar15 + auVar83._16_4_;
                  auVar82._20_4_ = fVar4 * fVar16 + auVar83._20_4_;
                  auVar82._24_4_ = fVar4 * fVar17 + auVar83._24_4_;
                  auVar82._28_4_ = fVar1 + auVar83._28_4_;
                  auVar83 = ZEXT3264(auVar82);
                  auVar78._0_4_ = fVar2 * fVar11 + auVar79._0_4_;
                  auVar78._4_4_ = fVar2 * fVar12 + auVar79._4_4_;
                  auVar78._8_4_ = fVar2 * fVar13 + auVar79._8_4_;
                  auVar78._12_4_ = fVar2 * fVar14 + auVar79._12_4_;
                  auVar78._16_4_ = fVar2 * fVar15 + auVar79._16_4_;
                  auVar78._20_4_ = fVar2 * fVar16 + auVar79._20_4_;
                  auVar78._24_4_ = fVar2 * fVar17 + auVar79._24_4_;
                  auVar78._28_4_ = fVar1 + auVar79._28_4_;
                  auVar79 = ZEXT3264(auVar78);
                  fVar2 = pfVar25[6];
                  fVar4 = pfVar25[7];
                  auVar71._0_4_ = fVar3 * fVar11 + auVar73._0_4_;
                  auVar71._4_4_ = fVar3 * fVar12 + auVar73._4_4_;
                  auVar71._8_4_ = fVar3 * fVar13 + auVar73._8_4_;
                  auVar71._12_4_ = fVar3 * fVar14 + auVar73._12_4_;
                  auVar71._16_4_ = fVar3 * fVar15 + auVar73._16_4_;
                  auVar71._20_4_ = fVar3 * fVar16 + auVar73._20_4_;
                  auVar71._24_4_ = fVar3 * fVar17 + auVar73._24_4_;
                  auVar71._28_4_ = fVar1 + auVar73._28_4_;
                  auVar73 = ZEXT3264(auVar71);
                  auVar66._0_4_ = fVar2 * fVar11 + auVar68._0_4_;
                  auVar66._4_4_ = fVar2 * fVar12 + auVar68._4_4_;
                  auVar66._8_4_ = fVar2 * fVar13 + auVar68._8_4_;
                  auVar66._12_4_ = fVar2 * fVar14 + auVar68._12_4_;
                  auVar66._16_4_ = fVar2 * fVar15 + auVar68._16_4_;
                  auVar66._20_4_ = fVar2 * fVar16 + auVar68._20_4_;
                  auVar66._24_4_ = fVar2 * fVar17 + auVar68._24_4_;
                  auVar66._28_4_ = fVar1 + auVar68._28_4_;
                  auVar68 = ZEXT3264(auVar66);
                  fVar2 = pfVar25[8];
                  fVar3 = pfVar25[9];
                  auVar62._0_4_ = fVar4 * fVar11 + auVar64._0_4_;
                  auVar62._4_4_ = fVar4 * fVar12 + auVar64._4_4_;
                  auVar62._8_4_ = fVar4 * fVar13 + auVar64._8_4_;
                  auVar62._12_4_ = fVar4 * fVar14 + auVar64._12_4_;
                  auVar62._16_4_ = fVar4 * fVar15 + auVar64._16_4_;
                  auVar62._20_4_ = fVar4 * fVar16 + auVar64._20_4_;
                  auVar62._24_4_ = fVar4 * fVar17 + auVar64._24_4_;
                  auVar62._28_4_ = fVar1 + auVar64._28_4_;
                  auVar64 = ZEXT3264(auVar62);
                  auVar58._0_4_ = fVar2 * fVar11 + auVar61._0_4_;
                  auVar58._4_4_ = fVar2 * fVar12 + auVar61._4_4_;
                  auVar58._8_4_ = fVar2 * fVar13 + auVar61._8_4_;
                  auVar58._12_4_ = fVar2 * fVar14 + auVar61._12_4_;
                  auVar58._16_4_ = fVar2 * fVar15 + auVar61._16_4_;
                  auVar58._20_4_ = fVar2 * fVar16 + auVar61._20_4_;
                  auVar58._24_4_ = fVar2 * fVar17 + auVar61._24_4_;
                  auVar58._28_4_ = fVar1 + auVar61._28_4_;
                  auVar61 = ZEXT3264(auVar58);
                  fVar2 = pfVar25[10];
                  fVar4 = pfVar25[0xb];
                  auVar54._0_4_ = fVar3 * fVar11 + auVar57._0_4_;
                  auVar54._4_4_ = fVar3 * fVar12 + auVar57._4_4_;
                  auVar54._8_4_ = fVar3 * fVar13 + auVar57._8_4_;
                  auVar54._12_4_ = fVar3 * fVar14 + auVar57._12_4_;
                  auVar54._16_4_ = fVar3 * fVar15 + auVar57._16_4_;
                  auVar54._20_4_ = fVar3 * fVar16 + auVar57._20_4_;
                  auVar54._24_4_ = fVar3 * fVar17 + auVar57._24_4_;
                  auVar54._28_4_ = fVar1 + auVar57._28_4_;
                  auVar57 = ZEXT3264(auVar54);
                  auVar48._0_4_ = fVar2 * fVar11 + auVar52._0_4_;
                  auVar48._4_4_ = fVar2 * fVar12 + auVar52._4_4_;
                  auVar48._8_4_ = fVar2 * fVar13 + auVar52._8_4_;
                  auVar48._12_4_ = fVar2 * fVar14 + auVar52._12_4_;
                  auVar48._16_4_ = fVar2 * fVar15 + auVar52._16_4_;
                  auVar48._20_4_ = fVar2 * fVar16 + auVar52._20_4_;
                  auVar48._24_4_ = fVar2 * fVar17 + auVar52._24_4_;
                  auVar48._28_4_ = fVar1 + auVar52._28_4_;
                  auVar52 = ZEXT3264(auVar48);
                  fVar39 = fVar4 * fVar11 + fVar39;
                  fVar40 = fVar4 * fVar12 + fVar40;
                  fVar41 = fVar4 * fVar13 + fVar41;
                  fVar42 = fVar4 * fVar14 + fVar42;
                  fVar43 = fVar4 * fVar15 + fVar43;
                  fVar44 = fVar4 * fVar16 + fVar44;
                  fVar45 = fVar4 * fVar17 + fVar45;
                  fVar46 = pfVar37[7] + fVar46;
                  pfVar25 = pfVar25 + 0xc;
                  pfVar37 = pfVar37 + 8;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              *pauVar27 = auVar75;
              pauVar27[1] = auVar90;
              pauVar27[2] = auVar86;
              pauVar27[3] = auVar82;
              pauVar27[4] = auVar78;
              pauVar27[5] = auVar71;
              pauVar27[6] = auVar66;
              pauVar27[7] = auVar62;
              pauVar27[8] = auVar58;
              pauVar27[9] = auVar54;
              pauVar27[10] = auVar48;
              *(float *)pauVar27[0xb] = fVar39;
              *(float *)(pauVar27[0xb] + 4) = fVar40;
              *(float *)(pauVar27[0xb] + 8) = fVar41;
              *(float *)(pauVar27[0xb] + 0xc) = fVar42;
              *(float *)(pauVar27[0xb] + 0x10) = fVar43;
              *(float *)(pauVar27[0xb] + 0x14) = fVar44;
              *(float *)(pauVar27[0xb] + 0x18) = fVar45;
              *(float *)(pauVar27[0xb] + 0x1c) = fVar46;
              pauVar27 = pauVar27 + 0xc;
              uVar30 = uVar34 + 0xc;
              iVar18 = (int)uVar34;
              uVar34 = uVar30;
              uVar36 = local_48;
            } while (iVar18 + 0x17 < (int)_w);
          }
          uVar20 = (uint)uVar30;
          for (iVar18 = uVar20 + 7; iVar18 < (int)_w; iVar18 = iVar18 + 0xf) {
            iVar18 = (int)uVar30;
            if (iVar5 < 1) {
              auVar76 = SUB6432(ZEXT864(0),0);
              auVar72 = SUB6432(ZEXT864(0),0);
              auVar67 = SUB6432(ZEXT864(0),0);
              auVar63 = SUB6432(ZEXT864(0),0);
              auVar59 = SUB6432(ZEXT864(0),0);
              auVar55 = SUB6432(ZEXT864(0),0);
              auVar49 = SUB6432(ZEXT864(0),0);
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar46 = 0.0;
            }
            else {
              lVar21 = ((ulong)(((uint)(iVar18 + (int)((uVar30 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                               (int)((uVar30 & 0xffffffff) / 0xc)) * lVar22 + lVar32) * lVar19;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar46 = 0.0;
              lVar26 = 0;
              auVar52 = ZEXT864(0);
              auVar57 = ZEXT864(0);
              auVar61 = ZEXT864(0);
              auVar64 = ZEXT864(0);
              auVar68 = ZEXT864(0);
              auVar73 = ZEXT864(0);
              auVar77 = ZEXT864(0);
              iVar31 = iVar28;
              do {
                pfVar37 = (float *)((long)pvVar33 + lVar26);
                fVar3 = *pfVar37;
                fVar4 = pfVar37[1];
                fVar11 = pfVar37[2];
                fVar12 = pfVar37[3];
                fVar13 = pfVar37[4];
                fVar14 = pfVar37[5];
                fVar15 = pfVar37[6];
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar26 + lVar21);
                fVar2 = *(float *)((long)(_func_int ***)local_98.data + lVar26 + lVar21 + 4);
                auVar76._0_4_ = fVar1 * fVar3 + auVar77._0_4_;
                auVar76._4_4_ = fVar1 * fVar4 + auVar77._4_4_;
                auVar76._8_4_ = fVar1 * fVar11 + auVar77._8_4_;
                auVar76._12_4_ = fVar1 * fVar12 + auVar77._12_4_;
                auVar76._16_4_ = fVar1 * fVar13 + auVar77._16_4_;
                auVar76._20_4_ = fVar1 * fVar14 + auVar77._20_4_;
                auVar76._24_4_ = fVar1 * fVar15 + auVar77._24_4_;
                auVar76._28_4_ = fVar1 + auVar77._28_4_;
                auVar77 = ZEXT3264(auVar76);
                auVar72._0_4_ = fVar2 * fVar3 + auVar73._0_4_;
                auVar72._4_4_ = fVar2 * fVar4 + auVar73._4_4_;
                auVar72._8_4_ = fVar2 * fVar11 + auVar73._8_4_;
                auVar72._12_4_ = fVar2 * fVar12 + auVar73._12_4_;
                auVar72._16_4_ = fVar2 * fVar13 + auVar73._16_4_;
                auVar72._20_4_ = fVar2 * fVar14 + auVar73._20_4_;
                auVar72._24_4_ = fVar2 * fVar15 + auVar73._24_4_;
                auVar72._28_4_ = fVar1 + auVar73._28_4_;
                auVar73 = ZEXT3264(auVar72);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar26 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar26 + lVar21 + 4);
                auVar67._0_4_ = fVar1 * fVar3 + auVar68._0_4_;
                auVar67._4_4_ = fVar1 * fVar4 + auVar68._4_4_;
                auVar67._8_4_ = fVar1 * fVar11 + auVar68._8_4_;
                auVar67._12_4_ = fVar1 * fVar12 + auVar68._12_4_;
                auVar67._16_4_ = fVar1 * fVar13 + auVar68._16_4_;
                auVar67._20_4_ = fVar1 * fVar14 + auVar68._20_4_;
                auVar67._24_4_ = fVar1 * fVar15 + auVar68._24_4_;
                auVar67._28_4_ = fVar1 + auVar68._28_4_;
                auVar68 = ZEXT3264(auVar67);
                auVar63._0_4_ = fVar2 * fVar3 + auVar64._0_4_;
                auVar63._4_4_ = fVar2 * fVar4 + auVar64._4_4_;
                auVar63._8_4_ = fVar2 * fVar11 + auVar64._8_4_;
                auVar63._12_4_ = fVar2 * fVar12 + auVar64._12_4_;
                auVar63._16_4_ = fVar2 * fVar13 + auVar64._16_4_;
                auVar63._20_4_ = fVar2 * fVar14 + auVar64._20_4_;
                auVar63._24_4_ = fVar2 * fVar15 + auVar64._24_4_;
                auVar63._28_4_ = fVar1 + auVar64._28_4_;
                auVar64 = ZEXT3264(auVar63);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x10))->
                                          _vptr_Allocator + lVar26 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x10))->
                                          _vptr_Allocator + lVar26 + lVar21 + 4);
                auVar59._0_4_ = fVar1 * fVar3 + auVar61._0_4_;
                auVar59._4_4_ = fVar1 * fVar4 + auVar61._4_4_;
                auVar59._8_4_ = fVar1 * fVar11 + auVar61._8_4_;
                auVar59._12_4_ = fVar1 * fVar12 + auVar61._12_4_;
                auVar59._16_4_ = fVar1 * fVar13 + auVar61._16_4_;
                auVar59._20_4_ = fVar1 * fVar14 + auVar61._20_4_;
                auVar59._24_4_ = fVar1 * fVar15 + auVar61._24_4_;
                auVar59._28_4_ = fVar1 + auVar61._28_4_;
                auVar61 = ZEXT3264(auVar59);
                auVar55._0_4_ = fVar2 * fVar3 + auVar57._0_4_;
                auVar55._4_4_ = fVar2 * fVar4 + auVar57._4_4_;
                auVar55._8_4_ = fVar2 * fVar11 + auVar57._8_4_;
                auVar55._12_4_ = fVar2 * fVar12 + auVar57._12_4_;
                auVar55._16_4_ = fVar2 * fVar13 + auVar57._16_4_;
                auVar55._20_4_ = fVar2 * fVar14 + auVar57._20_4_;
                auVar55._24_4_ = fVar2 * fVar15 + auVar57._24_4_;
                auVar55._28_4_ = fVar1 + auVar57._28_4_;
                auVar57 = ZEXT3264(auVar55);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x18))->
                                          _vptr_Allocator + lVar26 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x18))->
                                          _vptr_Allocator + lVar26 + lVar21 + 4);
                auVar49._0_4_ = fVar1 * fVar3 + auVar52._0_4_;
                auVar49._4_4_ = fVar1 * fVar4 + auVar52._4_4_;
                auVar49._8_4_ = fVar1 * fVar11 + auVar52._8_4_;
                auVar49._12_4_ = fVar1 * fVar12 + auVar52._12_4_;
                auVar49._16_4_ = fVar1 * fVar13 + auVar52._16_4_;
                auVar49._20_4_ = fVar1 * fVar14 + auVar52._20_4_;
                auVar49._24_4_ = fVar1 * fVar15 + auVar52._24_4_;
                auVar49._28_4_ = fVar1 + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar49);
                fVar39 = fVar2 * fVar3 + fVar39;
                fVar40 = fVar2 * fVar4 + fVar40;
                fVar41 = fVar2 * fVar11 + fVar41;
                fVar42 = fVar2 * fVar12 + fVar42;
                fVar43 = fVar2 * fVar13 + fVar43;
                fVar44 = fVar2 * fVar14 + fVar44;
                fVar45 = fVar2 * fVar15 + fVar45;
                fVar46 = pfVar37[7] + fVar46;
                lVar26 = lVar26 + 0x20;
                iVar31 = iVar31 + -1;
              } while (iVar31 != 0);
            }
            *pauVar27 = auVar76;
            pauVar27[1] = auVar72;
            pauVar27[2] = auVar67;
            pauVar27[3] = auVar63;
            pauVar27[4] = auVar59;
            pauVar27[5] = auVar55;
            pauVar27[6] = auVar49;
            *(float *)pauVar27[7] = fVar39;
            *(float *)(pauVar27[7] + 4) = fVar40;
            *(float *)(pauVar27[7] + 8) = fVar41;
            *(float *)(pauVar27[7] + 0xc) = fVar42;
            *(float *)(pauVar27[7] + 0x10) = fVar43;
            *(float *)(pauVar27[7] + 0x14) = fVar44;
            *(float *)(pauVar27[7] + 0x18) = fVar45;
            *(float *)(pauVar27[7] + 0x1c) = fVar46;
            pauVar27 = pauVar27 + 8;
            uVar20 = iVar18 + 8;
            uVar30 = (ulong)uVar20;
          }
          uVar29 = uVar20 | 3;
          while ((int)uVar29 < (int)_w) {
            if (iVar5 < 1) {
              auVar60 = SUB6432(ZEXT864(0),0);
              auVar56 = SUB6432(ZEXT864(0),0);
              auVar50 = SUB6432(ZEXT864(0),0);
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar46 = 0.0;
            }
            else {
              lVar21 = ((ulong)((uVar20 % 0xc >> 3) + uVar20 / 0xc +
                               (uint)((uVar20 % 0xc >> 2 & 1) != 0)) * lVar22 + lVar32) * lVar19;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar46 = 0.0;
              lVar26 = 0;
              auVar52 = ZEXT864(0);
              auVar57 = ZEXT864(0);
              auVar61 = ZEXT864(0);
              iVar18 = iVar28;
              do {
                pfVar37 = (float *)((long)pvVar33 + lVar26 * 2);
                fVar3 = *pfVar37;
                fVar4 = pfVar37[1];
                fVar11 = pfVar37[2];
                fVar12 = pfVar37[3];
                fVar13 = pfVar37[4];
                fVar14 = pfVar37[5];
                fVar15 = pfVar37[6];
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar26 + lVar21);
                fVar2 = *(float *)((long)(_func_int ***)local_98.data + lVar26 + lVar21 + 4);
                auVar60._0_4_ = fVar1 * fVar3 + auVar61._0_4_;
                auVar60._4_4_ = fVar1 * fVar4 + auVar61._4_4_;
                auVar60._8_4_ = fVar1 * fVar11 + auVar61._8_4_;
                auVar60._12_4_ = fVar1 * fVar12 + auVar61._12_4_;
                auVar60._16_4_ = fVar1 * fVar13 + auVar61._16_4_;
                auVar60._20_4_ = fVar1 * fVar14 + auVar61._20_4_;
                auVar60._24_4_ = fVar1 * fVar15 + auVar61._24_4_;
                auVar60._28_4_ = fVar1 + auVar61._28_4_;
                auVar61 = ZEXT3264(auVar60);
                auVar56._0_4_ = fVar2 * fVar3 + auVar57._0_4_;
                auVar56._4_4_ = fVar2 * fVar4 + auVar57._4_4_;
                auVar56._8_4_ = fVar2 * fVar11 + auVar57._8_4_;
                auVar56._12_4_ = fVar2 * fVar12 + auVar57._12_4_;
                auVar56._16_4_ = fVar2 * fVar13 + auVar57._16_4_;
                auVar56._20_4_ = fVar2 * fVar14 + auVar57._20_4_;
                auVar56._24_4_ = fVar2 * fVar15 + auVar57._24_4_;
                auVar56._28_4_ = fVar1 + auVar57._28_4_;
                auVar57 = ZEXT3264(auVar56);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar26 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar26 + lVar21 + 4);
                auVar50._0_4_ = fVar1 * fVar3 + auVar52._0_4_;
                auVar50._4_4_ = fVar1 * fVar4 + auVar52._4_4_;
                auVar50._8_4_ = fVar1 * fVar11 + auVar52._8_4_;
                auVar50._12_4_ = fVar1 * fVar12 + auVar52._12_4_;
                auVar50._16_4_ = fVar1 * fVar13 + auVar52._16_4_;
                auVar50._20_4_ = fVar1 * fVar14 + auVar52._20_4_;
                auVar50._24_4_ = fVar1 * fVar15 + auVar52._24_4_;
                auVar50._28_4_ = fVar1 + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar50);
                fVar39 = fVar2 * fVar3 + fVar39;
                fVar40 = fVar2 * fVar4 + fVar40;
                fVar41 = fVar2 * fVar11 + fVar41;
                fVar42 = fVar2 * fVar12 + fVar42;
                fVar43 = fVar2 * fVar13 + fVar43;
                fVar44 = fVar2 * fVar14 + fVar44;
                fVar45 = fVar2 * fVar15 + fVar45;
                fVar46 = pfVar37[7] + fVar46;
                lVar26 = lVar26 + 0x10;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            *pauVar27 = auVar60;
            pauVar27[1] = auVar56;
            pauVar27[2] = auVar50;
            *(float *)pauVar27[3] = fVar39;
            *(float *)(pauVar27[3] + 4) = fVar40;
            *(float *)(pauVar27[3] + 8) = fVar41;
            *(float *)(pauVar27[3] + 0xc) = fVar42;
            *(float *)(pauVar27[3] + 0x10) = fVar43;
            *(float *)(pauVar27[3] + 0x14) = fVar44;
            *(float *)(pauVar27[3] + 0x18) = fVar45;
            *(float *)(pauVar27[3] + 0x1c) = fVar46;
            pauVar27 = pauVar27 + 4;
            uVar29 = uVar20 + 7;
            uVar20 = uVar20 + 4;
          }
          uVar29 = uVar20 | 1;
          while ((int)uVar29 < (int)_w) {
            uVar29 = uVar20 % 0xc;
            if (iVar5 < 1) {
              auVar51 = SUB6432(ZEXT864(0),0);
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar46 = 0.0;
            }
            else {
              lVar21 = ((ulong)((uVar29 >> 2 & 1) + (uVar29 >> 3) + uVar20 / 0xc +
                               (uint)((uVar29 >> 1 & 1) != 0)) * lVar22 + lVar32) * lVar19;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar46 = 0.0;
              lVar26 = 0;
              auVar52 = ZEXT864(0);
              iVar18 = iVar28;
              do {
                pfVar37 = (float *)((long)pvVar33 + lVar26 * 4);
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar26 + lVar21);
                fVar2 = *(float *)((long)(_func_int ***)local_98.data + lVar26 + lVar21 + 4);
                auVar51._0_4_ = fVar1 * *pfVar37 + auVar52._0_4_;
                auVar51._4_4_ = fVar1 * pfVar37[1] + auVar52._4_4_;
                auVar51._8_4_ = fVar1 * pfVar37[2] + auVar52._8_4_;
                auVar51._12_4_ = fVar1 * pfVar37[3] + auVar52._12_4_;
                auVar51._16_4_ = fVar1 * pfVar37[4] + auVar52._16_4_;
                auVar51._20_4_ = fVar1 * pfVar37[5] + auVar52._20_4_;
                auVar51._24_4_ = fVar1 * pfVar37[6] + auVar52._24_4_;
                auVar51._28_4_ = fVar1 + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar51);
                fVar39 = fVar2 * *pfVar37 + fVar39;
                fVar40 = fVar2 * pfVar37[1] + fVar40;
                fVar41 = fVar2 * pfVar37[2] + fVar41;
                fVar42 = fVar2 * pfVar37[3] + fVar42;
                fVar43 = fVar2 * pfVar37[4] + fVar43;
                fVar44 = fVar2 * pfVar37[5] + fVar44;
                fVar45 = fVar2 * pfVar37[6] + fVar45;
                fVar46 = pfVar37[7] + fVar46;
                lVar26 = lVar26 + 8;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            *pauVar27 = auVar51;
            *(float *)pauVar27[1] = fVar39;
            *(float *)(pauVar27[1] + 4) = fVar40;
            *(float *)(pauVar27[1] + 8) = fVar41;
            *(float *)(pauVar27[1] + 0xc) = fVar42;
            *(float *)(pauVar27[1] + 0x10) = fVar43;
            *(float *)(pauVar27[1] + 0x14) = fVar44;
            *(float *)(pauVar27[1] + 0x18) = fVar45;
            *(float *)(pauVar27[1] + 0x1c) = fVar46;
            pauVar27 = pauVar27 + 2;
            uVar29 = uVar20 + 3;
            uVar20 = uVar20 + 2;
          }
          if ((int)uVar20 < (int)_w) {
            do {
              uVar29 = uVar20 % 0xc;
              if (iVar5 < 1) {
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                fVar45 = 0.0;
                fVar46 = 0.0;
              }
              else {
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                fVar45 = 0.0;
                fVar46 = 0.0;
                lVar21 = 0;
                iVar18 = iVar28;
                do {
                  fVar1 = *(float *)((long)(_func_int ***)local_98.data +
                                    lVar21 + ((ulong)((uVar29 >> 2 & 1) +
                                                      (uVar20 & 1) + uVar20 / 0xc + (uVar29 >> 3) +
                                                     (uint)((uVar29 >> 1 & 1) != 0)) * lVar22 +
                                             lVar32) * lVar19);
                  pfVar37 = (float *)((long)pvVar33 + lVar21 * 8);
                  fVar39 = fVar1 * *pfVar37 + fVar39;
                  fVar40 = fVar1 * pfVar37[1] + fVar40;
                  fVar41 = fVar1 * pfVar37[2] + fVar41;
                  fVar42 = fVar1 * pfVar37[3] + fVar42;
                  fVar43 = fVar1 * pfVar37[4] + fVar43;
                  fVar44 = fVar1 * pfVar37[5] + fVar44;
                  fVar45 = fVar1 * pfVar37[6] + fVar45;
                  fVar46 = fVar1 + fVar46;
                  lVar21 = lVar21 + 4;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              *(float *)*pauVar27 = fVar39;
              *(float *)(*pauVar27 + 4) = fVar40;
              *(float *)(*pauVar27 + 8) = fVar41;
              *(float *)(*pauVar27 + 0xc) = fVar42;
              *(float *)(*pauVar27 + 0x10) = fVar43;
              *(float *)(*pauVar27 + 0x14) = fVar44;
              *(float *)(*pauVar27 + 0x18) = fVar45;
              *(float *)(*pauVar27 + 0x1c) = fVar46;
              pauVar27 = pauVar27 + 1;
              uVar20 = uVar20 + 1;
            } while (uVar20 != _w);
          }
          uVar38 = uVar38 + 1;
          pvVar33 = (void *)((long)pvVar33 + lVar24);
        } while (uVar38 != uVar36);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_38);
  }
  piVar6 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_98.data != (Allocator *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack8_avx(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 32u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;

        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x12
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(r0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(r0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(r0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(r0 + 8 * 11);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_unpacklo_ps(_r8, _r9);
                __m256 _tmp9 = _mm256_unpackhi_ps(_r8, _r9);
                __m256 _tmpa = _mm256_unpacklo_ps(_ra, _rb);
                __m256 _tmpb = _mm256_unpackhi_ps(_ra, _rb);
                __m256 _tmpc = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpg = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmph = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpi = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpj = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpk = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpl = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpm = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpn = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r5 = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 2, 0, 0));
                _r6 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r8 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 3, 0, 1));
                _r9 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 3, 0, 1));
                _ra = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));
                _rb = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);
                _mm256_store_ps(tmpptr + 8 * 8, _r8);
                _mm256_store_ps(tmpptr + 8 * 9, _r9);
                _mm256_store_ps(tmpptr + 8 * 10, _ra);
                _mm256_store_ps(tmpptr + 8 * 11, _rb);

                tmpptr += 96;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x8
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);

                tmpptr += 64;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x4
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);

                tmpptr += 32;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x2
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                _r0 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);

                tmpptr += 16;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }

        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;
            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                __m256 _val = _mm256_load_ps(r0);
                _mm256_store_ps(tmpptr, _val);

                tmpptr += 8;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();
                __m256 _sum8 = _mm256_setzero_ps();
                __m256 _sum9 = _mm256_setzero_ps();
                __m256 _suma = _mm256_setzero_ps();
                __m256 _sumb = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);
                    __m256 _val8 = _mm256_broadcast_ss(r0 + 8);
                    __m256 _val9 = _mm256_broadcast_ss(r0 + 9);
                    _sum8 = _mm256_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm256_comp_fmadd_ps(_val9, _w0, _sum9);
                    __m256 _vala = _mm256_broadcast_ss(r0 + 10);
                    __m256 _valb = _mm256_broadcast_ss(r0 + 11);
                    _suma = _mm256_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm256_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);
                _mm256_store_ps(output0_tm + 8 * 8, _sum8);
                _mm256_store_ps(output0_tm + 8 * 9, _sum9);
                _mm256_store_ps(output0_tm + 8 * 10, _suma);
                _mm256_store_ps(output0_tm + 8 * 11, _sumb);

                output0_tm += 8 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);

                output0_tm += 8 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);

                output0_tm += 8 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);

                output0_tm += 8 * 2;
            }

            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);
                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                    r0 += 1;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);

                output0_tm += 8;
            }
        }
    }
}